

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

bool __thiscall
Assimp::DefaultLogger::attachStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  uint uVar1;
  bool bVar2;
  reference ppLVar3;
  LogStreamInfo *this_00;
  LogStreamInfo *local_40;
  LogStreamInfo *pInfo;
  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_30;
  StreamIt it;
  uint severity_local;
  LogStream *pStream_local;
  DefaultLogger *this_local;
  
  if (pStream == (LogStream *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    it._M_current._4_4_ = severity;
    if (severity == 0) {
      it._M_current._4_4_ = 0xf;
    }
    local_30._M_current =
         (LogStreamInfo **)
         std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::begin
                   (&this->m_StreamArray);
    while( true ) {
      pInfo = (LogStreamInfo *)
              std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::end
                        (&this->m_StreamArray);
      bVar2 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                          *)&pInfo);
      if (!bVar2) break;
      ppLVar3 = __gnu_cxx::
                __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                ::operator*(&local_30);
      uVar1 = it._M_current._4_4_;
      if ((*ppLVar3)->m_pStream == pStream) {
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                  ::operator*(&local_30);
        (*ppLVar3)->m_uiErrorSeverity = uVar1 | (*ppLVar3)->m_uiErrorSeverity;
        return true;
      }
      __gnu_cxx::
      __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
      ::operator++(&local_30);
    }
    this_00 = (LogStreamInfo *)operator_new(0x10);
    LogStreamInfo::LogStreamInfo(this_00,it._M_current._4_4_,pStream);
    local_40 = this_00;
    std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::push_back
              (&this->m_StreamArray,&local_40);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DefaultLogger::attachStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = Logger::Info | Logger::Err | Logger::Warn | Logger::Debugging;
    }

    for ( StreamIt it = m_StreamArray.begin();
        it != m_StreamArray.end();
        ++it )
    {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity |= severity;
            return true;
        }
    }

    LogStreamInfo *pInfo = new LogStreamInfo( severity, pStream );
    m_StreamArray.push_back( pInfo );
    return true;
}